

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coord.cpp
# Opt level: O0

int despot::Coord::DirectionalDistance(Coord lhs,Coord rhs,int direction)

{
  int iStack_1c;
  int direction_local;
  Coord rhs_local;
  Coord lhs_local;
  
  iStack_1c = rhs.x;
  direction_local = rhs.y;
  rhs_local.x = lhs.x;
  rhs_local.y = lhs.y;
  switch(direction) {
  case 0:
    lhs_local.x = direction_local - rhs_local.y;
    break;
  case 1:
    lhs_local.x = iStack_1c - rhs_local.x;
    break;
  case 2:
    lhs_local.x = rhs_local.y - direction_local;
    break;
  case 3:
    lhs_local.x = rhs_local.x - iStack_1c;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/coord.cpp"
                  ,0x48,"static int despot::Coord::DirectionalDistance(Coord, Coord, int)");
  }
  return lhs_local.x;
}

Assistant:

int Coord::DirectionalDistance(Coord lhs, Coord rhs, int direction) {
	switch (direction) {
	case Compass::NORTH:
		return rhs.y - lhs.y;
	case Compass::EAST:
		return rhs.x - lhs.x;
	case Compass::SOUTH:
		return lhs.y - rhs.y;
	case Compass::WEST:
		return lhs.x - rhs.x;
	default:
		assert(false);
		return -1;
	}
}